

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O0

Scrubber *
ApprovalTests::Scrubbers::createRegexScrubber(regex *regexPattern,RegexReplacer *replacer)

{
  anon_class_64_2_3fae34b8 *in_RDI;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff78;
  anon_class_64_2_3fae34b8 *__f;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_58 [2];
  
  this = local_58;
  __f = in_RDI;
  ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&in_RDI->regexPattern,in_stack_ffffffffffffff78);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)this,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                      *)__f);
  ::std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<ApprovalTests::Scrubbers::createRegexScrubber(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&,std::function<std::__cxx11::string(std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const&)>const&)::__0,void>
            (this,__f);
  createRegexScrubber(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&,std::function<std::__cxx11::string(std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const&)>const&)
  ::$_0::~__0(in_RDI);
  return (Scrubber *)__f;
}

Assistant:

Scrubber createRegexScrubber(const std::regex& regexPattern,
                                     const RegexReplacer& replacer)
        {
            return [=](const std::string& input) {
                return scrubRegex(input, regexPattern, replacer);
            };
        }